

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

double sampleOctaveAmp(OctaveNoise *noise,double x,double y,double z,double yamp,double ymin,
                      int ydefault)

{
  long lVar1;
  int in_ESI;
  int *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double pv;
  double az;
  double ay;
  double ax;
  double lf;
  PerlinNoise *p;
  PerlinNoise *in_stack_00000040;
  int i;
  double v;
  int local_44;
  double local_40;
  
  local_40 = 0.0;
  for (local_44 = 0; local_44 < *in_RDI; local_44 = local_44 + 1) {
    lVar1 = *(long *)(in_RDI + 2) + (long)local_44 * 0x140;
    dVar2 = *(double *)(lVar1 + 0x128);
    maintainPrecision(in_XMM0_Qa * dVar2);
    if (in_ESI == 0) {
      maintainPrecision(in_XMM1_Qa * dVar2);
    }
    maintainPrecision(in_XMM2_Qa * dVar2);
    dVar2 = samplePerlin(in_stack_00000040,(double)p,lf,ax,ay,az);
    local_40 = *(double *)(lVar1 + 0x120) * dVar2 + local_40;
  }
  return local_40;
}

Assistant:

double sampleOctaveAmp(const OctaveNoise *noise, double x, double y, double z,
        double yamp, double ymin, int ydefault)
{
    double v = 0;
    int i;
    for (i = 0; i < noise->octcnt; i++)
    {
        PerlinNoise *p = noise->octaves + i;
        double lf = p->lacunarity;
        double ax = maintainPrecision(x * lf);
        double ay = ydefault ? -p->b : maintainPrecision(y * lf);
        double az = maintainPrecision(z * lf);
        double pv = samplePerlin(p, ax, ay, az, yamp * lf, ymin * lf);
        v += p->amplitude * pv;
    }
    return v;
}